

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O2

void __thiscall QByteArray::reserve(QByteArray *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  
  pDVar3 = (this->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((long)((((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar3->super_QArrayData).alloc) - (long)(this->d).ptr) < asize)) {
    lVar2 = (this->d).size;
    if (asize < lVar2) {
      asize = lVar2;
    }
    QByteArray::reallocData((longlong)this,(AllocationOption)asize);
    pDVar3 = (this->d).d;
    if (pDVar3 == (Data *)0x0) {
      return;
    }
  }
  if ((pDVar3->super_QArrayData).alloc != 0) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  return;
}

Assistant:

inline void QByteArray::reserve(qsizetype asize)
{
    if (d.needsDetach() || asize > capacity() - d.freeSpaceAtBegin())
        reallocData(qMax(size(), asize), QArrayData::KeepSize);
    if (d.constAllocatedCapacity())
        d.setFlag(Data::CapacityReserved);
}